

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void uv__signal_event(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv_signal_t *handle;
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  char buf [512];
  undefined8 local_238;
  int aiStack_230 [128];
  
  uVar4 = 0;
  uVar5 = 0;
  do {
    sVar1 = read(loop->signal_pipefd[0],(void *)((long)aiStack_230 + (uVar5 - 8)),0x200 - uVar5);
    if ((int)sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        if (*piVar2 != 0xb) {
          abort();
        }
        if (uVar5 == 0) {
          return;
        }
      }
    }
    else {
      uVar5 = (long)(int)sVar1 + uVar5;
      uVar4 = uVar5 & 0xfffffffffffffff0;
      for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 0x10) {
        handle = *(uv_signal_t **)((long)aiStack_230 + (uVar3 - 8));
        if (*(int *)((long)aiStack_230 + uVar3) == handle->signum) {
          if ((handle->flags & 1) != 0) {
            __assert_fail("!(handle->flags & UV_HANDLE_CLOSING)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                          ,0x1b2,"void uv__signal_event(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          (*handle->signal_cb)(handle,*(int *)((long)aiStack_230 + uVar3));
        }
        handle->dispatched_signals = handle->dispatched_signals + 1;
        if ((handle->flags & 0x2000000) != 0) {
          uv__signal_stop(handle);
        }
      }
      uVar5 = uVar5 & 0xf;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        memmove(&local_238,(void *)((long)aiStack_230 + (uVar4 - 8)),uVar5);
      }
    }
    bVar6 = uVar4 != 0x200;
    uVar4 = 0x200;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

static void uv__signal_event(uv_loop_t* loop,
                             uv__io_t* w,
                             unsigned int events) {
  uv__signal_msg_t* msg;
  uv_signal_t* handle;
  char buf[sizeof(uv__signal_msg_t) * 32];
  size_t bytes, end, i;
  int r;

  bytes = 0;
  end = 0;

  do {
    r = read(loop->signal_pipefd[0], buf + bytes, sizeof(buf) - bytes);

    if (r == -1 && errno == EINTR)
      continue;

    if (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)) {
      /* If there are bytes in the buffer already (which really is extremely
       * unlikely if possible at all) we can't exit the function here. We'll
       * spin until more bytes are read instead.
       */
      if (bytes > 0)
        continue;

      /* Otherwise, there was nothing there. */
      return;
    }

    /* Other errors really should never happen. */
    if (r == -1)
      abort();

    bytes += r;

    /* `end` is rounded down to a multiple of sizeof(uv__signal_msg_t). */
    end = (bytes / sizeof(uv__signal_msg_t)) * sizeof(uv__signal_msg_t);

    for (i = 0; i < end; i += sizeof(uv__signal_msg_t)) {
      msg = (uv__signal_msg_t*) (buf + i);
      handle = msg->handle;

      if (msg->signum == handle->signum) {
        assert(!(handle->flags & UV_HANDLE_CLOSING));
        handle->signal_cb(handle, handle->signum);
      }

      handle->dispatched_signals++;

      if (handle->flags & UV_SIGNAL_ONE_SHOT)
        uv__signal_stop(handle);
    }

    bytes -= end;

    /* If there are any "partial" messages left, move them to the start of the
     * the buffer, and spin. This should not happen.
     */
    if (bytes) {
      memmove(buf, buf + end, bytes);
      continue;
    }
  } while (end == sizeof buf);
}